

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

Vec_Int_t * Saig_ManComputeSwitchProbs(Aig_Man_t *pAig,int nFrames,int nPref,int fProbOne)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  Gia_Man_t *pGia;
  Vec_Int_t *p;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  pGia = Gia_ManFromAigSwitch(pAig);
  p = Gia_ManComputeSwitchProbs(pGia,nFrames,nPref,fProbOne);
  pVVar4 = Vec_IntStart(pAig->vObjs->nSize);
  lVar5 = 0;
  do {
    if (pAig->vObjs->nSize <= lVar5) {
      Vec_IntFree(p);
      Gia_ManStop(pGia);
      return pVVar4;
    }
    pvVar2 = pAig->vObjs->pArray[lVar5];
    if (pvVar2 != (void *)0x0) {
      uVar1 = *(uint *)((long)pvVar2 + 0x28);
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar3 = Vec_IntEntry(p,uVar1 >> 1);
      if (pVVar4->nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar4->pArray[lVar5] = iVar3;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * pAig, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching, * vResult;
    Gia_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // translate AIG into the intermediate form (takes care of choices if present!)
    p = Gia_ManFromAigSwitch( pAig );
    // perform the computation of switching activity
    vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    // transfer the computed result to the original AIG
    vResult = Vec_IntStart( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( Aig_ObjIsCo(pObj) )
//            printf( "%d=%f\n", i, Abc_Int2Float( Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) ) );
        Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) );
    }
    // delete intermediate results
    Vec_IntFree( vSwitching );
    Gia_ManStop( p );
    return vResult;
}